

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O0

char * err_reason_error_string(uint32_t packed_error,int symbol)

{
  uint32_t lib_00;
  uint key;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_28;
  uint32_t reason;
  uint32_t lib;
  int symbol_local;
  uint32_t packed_error_local;
  
  lib_00 = ERR_GET_LIB(packed_error);
  key = ERR_GET_REASON(packed_error);
  if (lib_00 == 2) {
    if ((symbol == 0) && (key < 0x7f)) {
      _symbol_local = strerror(key);
    }
    else {
      _symbol_local = (char *)0x0;
    }
  }
  else if (key < 0x23) {
    if (symbol == 0) {
      local_28 = kLibraryNames[key].str;
    }
    else {
      local_28 = kLibraryNames[key].reason_symbol;
    }
    _symbol_local = local_28;
  }
  else if (key < 100) {
    switch(key) {
    case 0x41:
      if (symbol == 0) {
        local_38 = "malloc failure";
      }
      else {
        local_38 = "MALLOC_FAILURE";
      }
      _symbol_local = local_38;
      break;
    case 0x42:
      _symbol_local = "function should not have been called";
      if (symbol != 0) {
        _symbol_local = "SHOULD_NOT_HAVE_BEEN_CALLED";
      }
      break;
    case 0x43:
      _symbol_local = "passed a null parameter";
      if (symbol != 0) {
        _symbol_local = "PASSED_NULL_PARAMETER";
      }
      break;
    case 0x44:
      if (symbol == 0) {
        local_40 = "internal error";
      }
      else {
        local_40 = "INTERNAL_ERROR";
      }
      _symbol_local = local_40;
      break;
    case 0x45:
      if (symbol == 0) {
        local_48 = "overflow";
      }
      else {
        local_48 = "OVERFLOW";
      }
      _symbol_local = local_48;
      break;
    default:
      _symbol_local = (char *)0x0;
    }
  }
  else {
    _symbol_local = err_string_lookup(lib_00,key,kOpenSSLReasonValues,0x2ff,"ASN1_LENGTH_MISMATCH");
  }
  return _symbol_local;
}

Assistant:

static const char *err_reason_error_string(uint32_t packed_error, int symbol) {
  const uint32_t lib = ERR_GET_LIB(packed_error);
  const uint32_t reason = ERR_GET_REASON(packed_error);

  if (lib == ERR_LIB_SYS) {
    if (!symbol && reason < 127) {
      return strerror(reason);
    }
    return NULL;
  }

  if (reason < ERR_NUM_LIBS) {
    return symbol ? kLibraryNames[reason].reason_symbol
                  : kLibraryNames[reason].str;
  }

  if (reason < 100) {
    // TODO(davidben): All our other reason strings match the symbol name. Only
    // the common ones differ. Should we just consistently return the symbol
    // name?
    switch (reason) {
      case ERR_R_MALLOC_FAILURE:
        return symbol ? "MALLOC_FAILURE" : "malloc failure";
      case ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED:
        return symbol ? "SHOULD_NOT_HAVE_BEEN_CALLED"
                      : "function should not have been called";
      case ERR_R_PASSED_NULL_PARAMETER:
        return symbol ? "PASSED_NULL_PARAMETER" : "passed a null parameter";
      case ERR_R_INTERNAL_ERROR:
        return symbol ? "INTERNAL_ERROR" : "internal error";
      case ERR_R_OVERFLOW:
        return symbol ? "OVERFLOW" : "overflow";
      default:
        return NULL;
    }
  }

  // Unlike OpenSSL, BoringSSL's reason strings already match symbol name, so we
  // do not need to check |symbol|.
  return err_string_lookup(lib, reason, kOpenSSLReasonValues,
                           kOpenSSLReasonValuesLen, kOpenSSLReasonStringData);
}